

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qidentityproxymodel.cpp
# Opt level: O0

void __thiscall
QIdentityProxyModelPrivate::sourceLayoutChanged
          (QIdentityProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  bool bVar1;
  QModelIndex *pQVar2;
  qsizetype qVar3;
  QPersistentModelIndex *this_00;
  QList<QPersistentModelIndex> *in_RSI;
  QIdentityProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  QPersistentModelIndex *parent;
  QList<QPersistentModelIndex> *__range1;
  int i;
  QIdentityProxyModel *q;
  QModelIndex mappedParent;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPersistentModelIndex> parents;
  QModelIndex *in_stack_fffffffffffffea8;
  QModelIndex *in_stack_fffffffffffffeb0;
  LayoutChangeHint in_stack_fffffffffffffebc;
  QPersistentModelIndex *in_stack_fffffffffffffec0;
  QModelIndex *in_stack_fffffffffffffed0;
  QModelIndex *from;
  QModelIndex *this_01;
  int local_dc;
  undefined1 local_b0 [24];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPersistentModelIndex local_78;
  QPersistentModelIndex *local_70;
  const_iterator local_68;
  const_iterator local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QModelIndex *)q_func(in_RDI);
  local_dc = 0;
  while( true ) {
    qVar3 = QList<QModelIndex>::size(&in_RDI->proxyIndexes);
    if (qVar3 <= local_dc) break;
    this_01 = pQVar2;
    QList<QModelIndex>::at
              ((QList<QModelIndex> *)in_stack_fffffffffffffeb0,(qsizetype)in_stack_fffffffffffffea8)
    ;
    from = pQVar2;
    QList<QPersistentModelIndex>::at
              ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffeb0,
               (qsizetype)in_stack_fffffffffffffea8);
    QPersistentModelIndex::operator_cast_to_QModelIndex(in_stack_fffffffffffffec0);
    (**(code **)(*(long *)from + 0x198))(local_20,from,local_38);
    QAbstractItemModel::changePersistentIndex
              ((QAbstractItemModel *)this_01,from,in_stack_fffffffffffffed0);
    local_dc = local_dc + 1;
  }
  QList<QPersistentModelIndex>::clear((QList<QPersistentModelIndex> *)in_stack_fffffffffffffeb0);
  QList<QModelIndex>::clear((QList<QModelIndex> *)in_stack_fffffffffffffeb0);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QPersistentModelIndex>::QList((QList<QPersistentModelIndex> *)0x8686f6);
  QList<QPersistentModelIndex>::size(in_RSI);
  QList<QPersistentModelIndex>::reserve((QList<QPersistentModelIndex> *)in_RDI,(qsizetype)in_RSI);
  local_60.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_60 = QList<QPersistentModelIndex>::begin
                       ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffeb0);
  local_68.i = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = QList<QPersistentModelIndex>::end
                       ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffeb0);
  while( true ) {
    local_70 = local_68.i;
    bVar1 = QList<QPersistentModelIndex>::const_iterator::operator!=(&local_60,local_68);
    if (!bVar1) break;
    this_00 = QList<QPersistentModelIndex>::const_iterator::operator*(&local_60);
    bVar1 = QPersistentModelIndex::isValid((QPersistentModelIndex *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffebc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffebc);
    if (bVar1) {
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffeb0 = pQVar2;
      QPersistentModelIndex::operator_cast_to_QModelIndex(this_00);
      (**(code **)(*(long *)in_stack_fffffffffffffeb0 + 0x198))
                (&local_98,in_stack_fffffffffffffeb0,local_b0);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      QList<QPersistentModelIndex>::operator<<
                ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffeb0,
                 (rvalue_ref)in_stack_fffffffffffffea8);
      QPersistentModelIndex::~QPersistentModelIndex
                ((QPersistentModelIndex *)in_stack_fffffffffffffeb0);
    }
    else {
      QPersistentModelIndex::QPersistentModelIndex(&local_78);
      QList<QPersistentModelIndex>::operator<<
                ((QList<QPersistentModelIndex> *)in_stack_fffffffffffffeb0,
                 (rvalue_ref)in_stack_fffffffffffffea8);
      QPersistentModelIndex::~QPersistentModelIndex
                ((QPersistentModelIndex *)in_stack_fffffffffffffeb0);
    }
    QList<QPersistentModelIndex>::const_iterator::operator++(&local_60);
  }
  QAbstractItemModel::layoutChanged
            ((QAbstractItemModel *)in_stack_fffffffffffffeb0,
             (QList<QPersistentModelIndex> *)in_stack_fffffffffffffea8,in_stack_fffffffffffffebc);
  QList<QPersistentModelIndex>::~QList((QList<QPersistentModelIndex> *)0x868962);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIdentityProxyModelPrivate::sourceLayoutChanged(
    const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QIdentityProxyModel);

    for (int i = 0; i < proxyIndexes.size(); ++i) {
        q->changePersistentIndex(proxyIndexes.at(i), q->mapFromSource(layoutChangePersistentIndexes.at(i)));
    }

    layoutChangePersistentIndexes.clear();
    proxyIndexes.clear();

    QList<QPersistentModelIndex> parents;
    parents.reserve(sourceParents.size());
    for (const QPersistentModelIndex &parent : sourceParents) {
        if (!parent.isValid()) {
            parents << QPersistentModelIndex();
            continue;
        }
        const QModelIndex mappedParent = q->mapFromSource(parent);
        Q_ASSERT(mappedParent.isValid());
        parents << mappedParent;
    }

    emit q->layoutChanged(parents, hint);
}